

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply-names.cc
# Opt level: O0

Result __thiscall wabt::anon_unknown_12::NameApplier::VisitModule(NameApplier *this,Module *module)

{
  bool bVar1;
  Result RVar2;
  size_type sVar3;
  reference ppFVar4;
  reference ppGVar5;
  reference ppEVar6;
  reference ppEVar7;
  reference ppEVar8;
  reference ppDVar9;
  reference ppVVar10;
  ulong local_88;
  size_t i_6;
  ulong local_78;
  size_t i_5;
  ulong local_68;
  size_t i_4;
  ulong local_58;
  size_t i_3;
  ulong local_48;
  size_t i_2;
  ulong local_38;
  size_t i_1;
  ulong local_28;
  size_t i;
  Module *module_local;
  NameApplier *this_local;
  
  this->module_ = module;
  local_28 = 0;
  while( true ) {
    sVar3 = std::vector<wabt::Func_*,_std::allocator<wabt::Func_*>_>::size(&module->funcs);
    if (sVar3 <= local_28) {
      local_38 = 0;
      while( true ) {
        sVar3 = std::vector<wabt::Global_*,_std::allocator<wabt::Global_*>_>::size(&module->globals)
        ;
        if (sVar3 <= local_38) {
          local_48 = 0;
          while( true ) {
            sVar3 = std::vector<wabt::Event_*,_std::allocator<wabt::Event_*>_>::size
                              (&module->events);
            if (sVar3 <= local_48) {
              local_58 = 0;
              while( true ) {
                sVar3 = std::vector<wabt::Export_*,_std::allocator<wabt::Export_*>_>::size
                                  (&module->exports);
                if (sVar3 <= local_58) {
                  local_68 = 0;
                  while( true ) {
                    sVar3 = std::vector<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>::
                            size(&module->elem_segments);
                    if (sVar3 <= local_68) {
                      local_78 = 0;
                      while( true ) {
                        sVar3 = std::
                                vector<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>::
                                size(&module->data_segments);
                        if (sVar3 <= local_78) {
                          local_88 = 0;
                          while( true ) {
                            sVar3 = std::vector<wabt::Var_*,_std::allocator<wabt::Var_*>_>::size
                                              (&module->starts);
                            if (sVar3 <= local_88) {
                              this->module_ = (Module *)0x0;
                              Result::Result((Result *)((long)&this_local + 4),Ok);
                              return (Result)this_local._4_4_;
                            }
                            ppVVar10 = std::vector<wabt::Var_*,_std::allocator<wabt::Var_*>_>::
                                       operator[](&module->starts,local_88);
                            RVar2 = VisitStart(this,*ppVVar10);
                            bVar1 = Failed(RVar2);
                            if (bVar1) break;
                            local_88 = local_88 + 1;
                          }
                          Result::Result((Result *)((long)&this_local + 4),Error);
                          return (Result)this_local._4_4_;
                        }
                        ppDVar9 = std::
                                  vector<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>
                                  ::operator[](&module->data_segments,local_78);
                        RVar2 = VisitDataSegment(this,(Index)local_78,*ppDVar9);
                        bVar1 = Failed(RVar2);
                        if (bVar1) break;
                        local_78 = local_78 + 1;
                      }
                      Result::Result((Result *)((long)&this_local + 4),Error);
                      return (Result)this_local._4_4_;
                    }
                    ppEVar8 = std::vector<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>
                              ::operator[](&module->elem_segments,local_68);
                    RVar2 = VisitElemSegment(this,(Index)local_68,*ppEVar8);
                    bVar1 = Failed(RVar2);
                    if (bVar1) break;
                    local_68 = local_68 + 1;
                  }
                  Result::Result((Result *)((long)&this_local + 4),Error);
                  return (Result)this_local._4_4_;
                }
                ppEVar7 = std::vector<wabt::Export_*,_std::allocator<wabt::Export_*>_>::operator[]
                                    (&module->exports,local_58);
                RVar2 = VisitExport(this,(Index)local_58,*ppEVar7);
                bVar1 = Failed(RVar2);
                if (bVar1) break;
                local_58 = local_58 + 1;
              }
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            ppEVar6 = std::vector<wabt::Event_*,_std::allocator<wabt::Event_*>_>::operator[]
                                (&module->events,local_48);
            RVar2 = VisitEvent(this,*ppEVar6);
            bVar1 = Failed(RVar2);
            if (bVar1) break;
            local_48 = local_48 + 1;
          }
          Result::Result((Result *)((long)&this_local + 4),Error);
          return (Result)this_local._4_4_;
        }
        ppGVar5 = std::vector<wabt::Global_*,_std::allocator<wabt::Global_*>_>::operator[]
                            (&module->globals,local_38);
        RVar2 = VisitGlobal(this,*ppGVar5);
        bVar1 = Failed(RVar2);
        if (bVar1) break;
        local_38 = local_38 + 1;
      }
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    ppFVar4 = std::vector<wabt::Func_*,_std::allocator<wabt::Func_*>_>::operator[]
                        (&module->funcs,local_28);
    RVar2 = VisitFunc(this,(Index)local_28,*ppFVar4);
    bVar1 = Failed(RVar2);
    if (bVar1) break;
    local_28 = local_28 + 1;
  }
  Result::Result((Result *)((long)&this_local + 4),Error);
  return (Result)this_local._4_4_;
}

Assistant:

Result NameApplier::VisitModule(Module* module) {
  module_ = module;
  for (size_t i = 0; i < module->funcs.size(); ++i)
    CHECK_RESULT(VisitFunc(i, module->funcs[i]));
  for (size_t i = 0; i < module->globals.size(); ++i)
    CHECK_RESULT(VisitGlobal(module->globals[i]));
  for (size_t i = 0; i < module->events.size(); ++i)
    CHECK_RESULT(VisitEvent(module->events[i]));
  for (size_t i = 0; i < module->exports.size(); ++i)
    CHECK_RESULT(VisitExport(i, module->exports[i]));
  for (size_t i = 0; i < module->elem_segments.size(); ++i)
    CHECK_RESULT(VisitElemSegment(i, module->elem_segments[i]));
  for (size_t i = 0; i < module->data_segments.size(); ++i)
    CHECK_RESULT(VisitDataSegment(i, module->data_segments[i]));
  for (size_t i = 0; i < module->starts.size(); ++i)
    CHECK_RESULT(VisitStart(module->starts[i]));
  module_ = nullptr;
  return Result::Ok;
}